

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::FixedLinearAllocator::AddSpace(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_80 [8];
  string msg_2;
  string msg_1;
  string msg;
  size_t alignment_local;
  size_t size_local;
  FixedLinearAllocator *this_local;
  
  msg.field_2._8_8_ = alignment;
  alignment_local = size;
  size_local = (size_t)this;
  if (this->m_pDataStart != (uint8_t *)0x0) {
    FormatString<char[46]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [46])"Memory has already been allocated or assigned");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x95);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  bVar1 = IsPowerOfTwo<unsigned_long>(msg.field_2._8_8_);
  if (!bVar1) {
    FormatString<char[33]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [33])"Alignment is not a power of two!");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x96);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (alignment_local != 0) {
    if (this->m_CurrAlignment == 0) {
      if (this->m_ReservedSize != 0) {
        FormatString<char[60]>
                  ((string *)local_80,
                   (char (*) [60])"This is expected to be a very first time the space is added");
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"AddSpace",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0x9d);
        std::__cxx11::string::~string((string *)local_80);
      }
      this->m_CurrAlignment = 8;
    }
    if (this->m_CurrAlignment < (ulong)msg.field_2._8_8_) {
      this->m_ReservedSize = (msg.field_2._8_8_ - this->m_CurrAlignment) + this->m_ReservedSize;
    }
    this->m_CurrAlignment = msg.field_2._8_8_;
    alignment_local = AlignUp<unsigned_long,unsigned_long>(alignment_local,msg.field_2._8_8_);
    this->m_ReservedSize = this->m_ReservedSize + alignment_local;
    std::
    vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
    ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long&>
              ((vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
                *)&this->m_DbgAllocations,&alignment_local,
               (unsigned_long *)(msg.field_2._M_local_buf + 8),&this->m_ReservedSize);
  }
  return;
}

Assistant:

void AddSpace(size_t size, size_t alignment = 1) noexcept
    {
        VERIFY(m_pDataStart == nullptr, "Memory has already been allocated or assigned");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return;

        if (m_CurrAlignment == 0)
        {
            VERIFY(m_ReservedSize == 0, "This is expected to be a very first time the space is added");
            m_CurrAlignment = sizeof(void*);
        }

        if (alignment > m_CurrAlignment)
        {
            // Reserve extra space that may be needed for alignment
            m_ReservedSize += alignment - m_CurrAlignment;
        }
        m_CurrAlignment = alignment;

        size = AlignUp(size, alignment);
        m_ReservedSize += size;

#if DILIGENT_DEBUG
        m_DbgAllocations.emplace_back(size, alignment, m_ReservedSize);
#endif
    }